

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantInnerTriangleSetCase::compare
          (InvariantInnerTriangleSetCase *this,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsA,
          vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coordsB,
          int param_3)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  float fVar3;
  TessPrimitiveType TVar4;
  TestLog *pTVar5;
  pointer pVVar6;
  pointer pVVar7;
  pointer pVVar8;
  pointer pVVar9;
  bool bVar10;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *pvVar11;
  int iVar12;
  Vector<float,_3> *pVVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  _Rb_tree_header *p_Var18;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *psVar19;
  long lVar20;
  Vector<tcu::Vector<float,_3>,_3> *b;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  Vector<float,_3> local_1d4;
  Vector<float,_3> local_1c8;
  Vector<float,_3> local_1bc;
  Triangle triangle;
  undefined1 local_18c [348];
  
  TVar4 = (this->super_PrimitiveSetInvarianceCase).m_primitiveType;
  if (TVar4 == TESSPRIMITIVETYPE_QUADS) {
    pTVar5 = ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    pVVar6 = (coordsA->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar7 = (coordsA->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar8 = (coordsB->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar9 = (coordsB->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &trianglesA._M_t._M_impl.super__Rb_tree_header._M_header;
    trianglesA._M_t._M_impl._0_1_ = 0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &trianglesB._M_t._M_impl.super__Rb_tree_header._M_header;
    trianglesB._M_t._M_impl._0_1_ = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
      lVar23 = (long)pVVar8 - (long)pVVar9;
      pvVar11 = coordsB;
      if (iVar12 == 0) {
        lVar23 = (long)pVVar6 - (long)pVVar7;
        pvVar11 = coordsA;
      }
      psVar19 = &trianglesB;
      if (iVar12 == 0) {
        psVar19 = &trianglesA;
      }
      uVar22 = (long)((ulong)(uint)((int)(lVar23 / 0xc) >> 0x1f) << 0x20 |
                     lVar23 / 0xc & 0xffffffffU) / 3;
      uVar21 = uVar22 & 0xffffffff;
      if ((int)uVar22 < 1) {
        uVar21 = 0;
      }
      for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
        lVar23 = uVar22 * 0x300000000;
        tcu::Vector<float,_3>::Vector
                  (&local_1bc,
                   (pvVar11->
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (lVar23 >> 0x20));
        tcu::Vector<float,_3>::Vector
                  (&local_1c8,
                   (pvVar11->
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (lVar23 + 0x100000000 >> 0x20));
        tcu::Vector<float,_3>::Vector
                  (&local_1d4,
                   (pvVar11->
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (lVar23 + 0x200000000 >> 0x20));
        tcu::Vector<tcu::Vector<float,_3>,_3>::Vector(&triangle,&local_1bc,&local_1c8,&local_1d4);
        pVVar13 = triangle.m_data;
        for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
          lVar20 = 0;
          while (lVar20 != 2) {
            fVar3 = ((Vector<float,_3> *)pVVar13->m_data)->m_data[lVar20];
            if ((fVar3 == 0.0) && (!NAN(fVar3))) goto LAB_01214d2d;
            lVar20 = lVar20 + 1;
            if ((fVar3 == 1.0) && (!NAN(fVar3))) goto LAB_01214d2d;
          }
          pVVar13 = pVVar13 + 1;
        }
        std::
        sort<tcu::Vector<float,3>*,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>
                  (&triangle,local_18c);
        std::
        set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
        ::insert(psVar19,&triangle);
LAB_01214d2d:
      }
    }
    p_Var1 = &trianglesA._M_t._M_impl.super__Rb_tree_header;
    p_Var16 = trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var17 = trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      p_Var18 = &trianglesB._M_t._M_impl.super__Rb_tree_header;
      bVar25 = (_Rb_tree_header *)p_Var16 == p_Var1;
      bVar24 = (_Rb_tree_header *)p_Var17 == p_Var18;
      bVar10 = bVar25 && bVar24;
      if (bVar10) break;
      if (((_Rb_tree_header *)p_Var17 == p_Var18) || ((_Rb_tree_header *)p_Var16 == p_Var1)) {
LAB_01214fdf:
        poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
        triangle.m_data[0].m_data._0_8_ = pTVar5;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                       );
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        local_238._M_string_length = 0;
        local_238.field_2._M_local_buf[0] = '\0';
        std::operator+(&local_218,&local_238,", and ");
        std::operator+(&local_1f8,&local_218,"outer triangles");
        std::operator<<((ostream *)poVar2,(string *)&local_1f8);
        std::operator<<((ostream *)poVar2,")");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        if ((bVar25) ||
           ((!bVar24 &&
            (bVar25 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var16 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var17 + 1),b_00), !bVar25)
            ))) {
          poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
          triangle.m_data[0].m_data._0_8_ = pTVar5;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var17 + 1));
          std::operator<<((ostream *)poVar2," exists for second case but not for first");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
          triangle.m_data[0].m_data._0_8_ = pTVar5;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1));
          std::operator<<((ostream *)poVar2," exists for first case but not for second");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        goto LAB_0121518c;
      }
      bVar25 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)(p_Var17 + 1));
      if (bVar25) {
        bVar25 = false;
        bVar24 = false;
        goto LAB_01214fdf;
      }
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    }
  }
  else {
    if (TVar4 != TESSPRIMITIVETYPE_TRIANGLES) {
      return false;
    }
    pTVar5 = ((this->super_PrimitiveSetInvarianceCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    pVVar6 = (coordsA->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar7 = (coordsA->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar8 = (coordsB->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar9 = (coordsB->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &trianglesA._M_t._M_impl.super__Rb_tree_header._M_header;
    trianglesA._M_t._M_impl._0_1_ = 0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &trianglesB._M_t._M_impl.super__Rb_tree_header._M_header;
    trianglesB._M_t._M_impl._0_1_ = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (iVar12 = 0; p_Var14 = trianglesA._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        p_Var15 = trianglesB._M_t._M_impl.super__Rb_tree_header._M_header._M_left, iVar12 != 2;
        iVar12 = iVar12 + 1) {
      lVar23 = (long)pVVar8 - (long)pVVar9;
      pvVar11 = coordsB;
      if (iVar12 == 0) {
        lVar23 = (long)pVVar6 - (long)pVVar7;
        pvVar11 = coordsA;
      }
      psVar19 = &trianglesB;
      if (iVar12 == 0) {
        psVar19 = &trianglesA;
      }
      uVar22 = (long)((ulong)(uint)((int)(lVar23 / 0xc) >> 0x1f) << 0x20 |
                     lVar23 / 0xc & 0xffffffffU) / 3;
      uVar21 = uVar22 & 0xffffffff;
      if ((int)uVar22 < 1) {
        uVar21 = 0;
      }
      for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
        lVar23 = uVar22 * 0x300000000;
        tcu::Vector<float,_3>::Vector
                  (&local_1bc,
                   (pvVar11->
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (lVar23 >> 0x20));
        tcu::Vector<float,_3>::Vector
                  (&local_1c8,
                   (pvVar11->
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (lVar23 + 0x100000000 >> 0x20));
        tcu::Vector<float,_3>::Vector
                  (&local_1d4,
                   (pvVar11->
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (lVar23 + 0x200000000 >> 0x20));
        tcu::Vector<tcu::Vector<float,_3>,_3>::Vector(&triangle,&local_1bc,&local_1c8,&local_1d4);
        pVVar13 = triangle.m_data;
        for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
          lVar20 = 0;
          while (lVar20 != 3) {
            fVar3 = ((Vector<float,_3> *)pVVar13->m_data)->m_data[lVar20];
            lVar20 = lVar20 + 1;
            if ((fVar3 == 0.0) && (!NAN(fVar3))) goto LAB_01214b53;
          }
          pVVar13 = pVVar13 + 1;
        }
        std::
        sort<tcu::Vector<float,3>*,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>>
                  (&triangle,local_18c);
        std::
        set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
        ::insert(psVar19,&triangle);
LAB_01214b53:
      }
    }
    while( true ) {
      bVar24 = (_Rb_tree_header *)p_Var14 == &trianglesA._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = &trianglesB._M_t._M_impl.super__Rb_tree_header;
      bVar25 = (_Rb_tree_header *)p_Var15 == p_Var1;
      bVar10 = bVar24 && bVar25;
      if (bVar10) break;
      if (((_Rb_tree_header *)p_Var15 == p_Var1) ||
         ((_Rb_tree_header *)p_Var14 == &trianglesA._M_t._M_impl.super__Rb_tree_header)) {
LAB_01214e2c:
        poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
        triangle.m_data[0].m_data._0_8_ = pTVar5;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                       );
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        local_238._M_string_length = 0;
        local_238.field_2._M_local_buf[0] = '\0';
        std::operator+(&local_218,&local_238,", and ");
        std::operator+(&local_1f8,&local_218,"outer triangles");
        std::operator<<((ostream *)poVar2,(string *)&local_1f8);
        std::operator<<((ostream *)poVar2,")");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        if ((bVar24) ||
           ((!bVar25 &&
            (bVar25 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var14 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1),b), !bVar25))))
        {
          poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
          triangle.m_data[0].m_data._0_8_ = pTVar5;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1));
          std::operator<<((ostream *)poVar2," exists for second case but not for first");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar2 = (ostringstream *)(triangle.m_data[0].m_data + 2);
          triangle.m_data[0].m_data._0_8_ = pTVar5;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,"Note: e.g. triangle ");
          tcu::operator<<((ostream *)poVar2,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1));
          std::operator<<((ostream *)poVar2," exists for first case but not for second");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
LAB_0121518c:
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)(triangle.m_data[0].m_data + 2));
        break;
      }
      bVar25 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator!=
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1));
      if (bVar25) {
        bVar24 = false;
        bVar25 = false;
        goto LAB_01214e2c;
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    }
  }
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::~set(&trianglesB);
  std::
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_deqp::gles31::Functional::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::~set(&trianglesA);
  return bVar10;
}

Assistant:

virtual bool compare (const vector<Vec3>& coordsA, const vector<Vec3>& coordsB, int) const
	{
		if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog(), IsInnerTriangleTriangle(), "outer triangles");
		else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
			return compareTriangleSets(coordsA, coordsB, m_testCtx.getLog(), IsInnerQuadTriangle(), "outer triangles");
		else
		{
			DE_ASSERT(false);
			return false;
		}
	}